

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O3

void __thiscall StringTest::Test7(StringTest *this)

{
  int iVar1;
  string t1;
  string t2;
  string t3;
  long *local_80;
  char *local_78;
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Hello World, this is a string","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,local_80,(undefined1 *)((long)local_78 + (long)local_80));
  std::__cxx11::string::erase((ulong)&local_80,0xb);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00104e0a;
  }
  else {
LAB_00104e0a:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x163,"Error on erase");
  }
  std::__cxx11::string::erase((ulong)&local_80,(ulong)local_78);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00104e64;
  }
  else {
LAB_00104e64:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x168,"Error on erase");
  }
  std::__cxx11::string::erase((ulong)&local_80,(long)local_78 - 1);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00104ec1;
  }
  else {
LAB_00104ec1:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x177,"Error on erase");
  }
  std::__cxx11::string::erase((ulong)&local_80,0);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00104f19;
  }
  else {
LAB_00104f19:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x17c,"Error on erase");
  }
  local_78 = (char *)0x0;
  *(undefined1 *)local_80 = 0;
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00104f6e;
  }
  else {
LAB_00104f6e:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x181,"Error on erase");
  }
  std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x107397);
  std::__cxx11::string::_M_assign((string *)local_60);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"to the ","");
  std::__cxx11::string::replace((ulong)&local_80,6,(char *)0x0,(ulong)local_40[0]);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_0010501d;
  }
  else {
LAB_0010501d:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x18e,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)&local_80,(string *)0x6,(ulong)local_40,3);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00105083;
  }
  else {
LAB_00105083:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x195,"Error on insert");
  }
  std::__cxx11::string::replace((ulong)&local_80,10,(char *)0x0,0x10750a);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_001050e8;
  }
  else {
LAB_001050e8:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x19c,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)&local_80,5,'\x01');
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_00105148;
  }
  else {
LAB_00105148:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1a3,"Error on insert");
  }
  std::__cxx11::string::insert((ulong)&local_80,0x12,'\x03');
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 != 0) goto LAB_001051a8;
  }
  else {
LAB_001051a8:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1aa,"Error on insert");
  }
  std::__cxx11::string::replace((ulong)&local_80,0x16,(char *)0x0,0x107575);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 == 0) goto LAB_0010522a;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
             ,0x1b1,"Error on insert");
LAB_0010522a:
  std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x7,(ulong)local_40[0]);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1ba,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)&local_80,0xb,(string *)0xa,(ulong)local_40,3);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1c1,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)&local_80,0xf,(char *)0x8,0x10760f);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1c8,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)&local_80,0x1a,(char *)0x5,0x107661);
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1cf,"Error on replace");
  }
  std::__cxx11::string::replace((ulong)&local_80,2,0x17,'\x03');
  iVar1 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1d6,"Error on replace");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void Test7()
	{
		// erase, insert, replace

		string t1 = "Hello World, this is a string";
		string t2 = t1;
		
		t1.erase( 11, 1 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );
		
		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase( t1.length(), 1 );

		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

#ifdef USE_JH_STRING		
		t1.erase( t1.length() + 1, 1 );

		LOG_NOTICE( "string is %s", t1.c_str() );
		LOG_NOTICE( "string is t2 %s", t2.c_str() );
		
		if ( t1 != "Hello World this is a string" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );
#endif

		t1.erase( t1.length() - 1, 2 );

		if ( t1 != "Hello World this is a strin" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase( 0, 2 );

		if ( t1 != "llo World this is a strin" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );

		t1.erase();

		if ( t1 != "" || t2 != "Hello World, this is a string" )
			TestFailed( "Error on erase" );
		
		t1 = "Hello World";
		t2 = t1;
		string t3 = "to the ";
		
		LOG_NOTICE( "starting insert tests" );
		
		t1.insert( 6, t3 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 6, t3, 3, 4 );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello the to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 10, "matador " );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello the matador to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 5, 1, ',' );
		
		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 18, 3, '!' );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador!!! to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );

		t1.insert( 22, "welcome my son", 8 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "Hello, the matador!!! welcome to the World" || t2 != "Hello World" )
			TestFailed( "Error on insert" );
		
		LOG_NOTICE( "starting replace tests" );

		t1.replace( 0, 7, t3 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the matador!!! welcome to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 11, 10, t3, 3, 3 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the welcome to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 15, 8, "the world", 4 );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the the to the World" )
			TestFailed( "Error on replace" );

		t1.replace( 26, 5, "the end" );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to the the the the to the the end" )
			TestFailed( "Error on replace" );

		t1.replace( 2, 23, 3, '.' );

		LOG_NOTICE( "string is %s", t1.c_str() );

		if ( t1 != "to... the end" )
			TestFailed( "Error on replace" );
		
		TestPassed();
	}